

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall sqlite_orm::internal::storage_base::on_open_internal(storage_base *this,sqlite3 *db)

{
  int iVar1;
  uint uVar2;
  _Rb_tree_node_base *p_Var3;
  system_error *this_00;
  error_category *peVar4;
  char *__what;
  error_code __ec;
  journal_mode local_51;
  string local_50;
  
  if (this->cachedForeignKeysCount != 0) {
    foreign_keys(this,db,true);
  }
  iVar1 = (this->pragma)._synchronous;
  if (iVar1 != -1) {
    pragma_t::synchronous(&this->pragma,iVar1);
  }
  if ((this->pragma)._journal_mode != -1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"journal_mode","");
    local_51 = (this->pragma)._journal_mode;
    pragma_t::set_pragma(&this->pragma,&local_50,&local_51,db);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var3 = (this->collatingFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(this->collatingFunctions)._M_t._M_impl.super__Rb_tree_header)
    {
      for (p_Var3 = (this->limit).limits._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(this->limit).limits._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        sqlite3_limit(db,p_Var3[1]._M_color,*(undefined4 *)&p_Var3[1].field_0x4);
      }
      if ((this->_busy_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
        sqlite3_busy_handler
                  (((this->connection)._M_t.
                    super___uniq_ptr_impl<sqlite_orm::internal::connection_holder,_std::default_delete<sqlite_orm::internal::connection_holder>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_sqlite_orm::internal::connection_holder_*,_std::default_delete<sqlite_orm::internal::connection_holder>_>
                    .super__Head_base<0UL,_sqlite_orm::internal::connection_holder_*,_false>.
                   _M_head_impl)->db,busy_handler_callback,this);
      }
      if ((this->on_open).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_50._M_dataplus._M_p = (pointer)db;
        (*(this->on_open)._M_invoker)((_Any_data *)this,(sqlite3 **)&local_50);
      }
      return;
    }
    iVar1 = sqlite3_create_collation(db,*(undefined8 *)(p_Var3 + 1),1,p_Var3 + 2,collate_callback);
    if (iVar1 != 0) break;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  uVar2 = sqlite3_errcode(db);
  peVar4 = &get_sqlite_error_category()->super_error_category;
  __what = (char *)sqlite3_errmsg(db);
  __ec._4_4_ = 0;
  __ec._M_value = uVar2;
  __ec._M_cat = peVar4;
  std::system_error::system_error(this_00,__ec,__what);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void on_open_internal(sqlite3 *db) {

#if SQLITE_VERSION_NUMBER >= 3006019
        if(this->cachedForeignKeysCount) {
            this->foreign_keys(db, true);
        }
#endif
        if(this->pragma._synchronous != -1) {
            this->pragma.synchronous(this->pragma._synchronous);
        }

        if(this->pragma._journal_mode != -1) {
            this->pragma.set_pragma("journal_mode", static_cast<journal_mode>(this->pragma._journal_mode), db);
        }

        for(auto &p: this->collatingFunctions) {
            if(sqlite3_create_collation(db, p.first.c_str(), SQLITE_UTF8, &p.second, collate_callback) !=
               SQLITE_OK) {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        }

        for(auto &p: this->limit.limits) {
            sqlite3_limit(db, p.first, p.second);
        }

        if(_busy_handler) {
            sqlite3_busy_handler(this->connection->get(), busy_handler_callback, this);
        }

        if(this->on_open) {
            this->on_open(db);
        }
    }